

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjalalicalendar.cpp
# Opt level: O0

YearMonthDay __thiscall QJalaliCalendar::julianDayToDate(QJalaliCalendar *this,qint64 jd)

{
  int iVar1;
  int iVar2;
  qint64 qVar3;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  YearMonthDay YVar4;
  int last;
  int month;
  int day;
  int year;
  int yearInCycle;
  int c;
  undefined8 in_stack_ffffffffffffff80;
  int local_74;
  int local_4c;
  int local_48;
  int local_44;
  YearMonthDay local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = cycle(0x7375ba);
  cycleStart(iVar1);
  iVar2 = qFloor<double>(3.7385127271835e-317);
  local_44 = iVar2 + 0x1db + iVar1 * 0xb04;
  qVar3 = firstDayOfYear((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (int)in_stack_ffffffffffffff80);
  local_48 = (in_ESI - (int)qVar3) + 1;
  local_74 = local_44;
  if (local_44 < 1) {
    local_74 = local_44 + -1;
  }
  iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_74);
  if (iVar1 < local_48) {
    local_44 = local_44 + 1;
    local_48 = 1;
  }
  if (local_44 < 1) {
    local_44 = local_44 + -1;
  }
  local_4c = 1;
  for (; (local_4c < 0xc &&
         (iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_4c,local_44), iVar1 < local_48));
      local_48 = local_48 - iVar1) {
    local_4c = local_4c + 1;
  }
  QCalendar::YearMonthDay::YearMonthDay(&local_14,local_44,local_4c,local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  YVar4.day = local_14.day;
  YVar4.year = local_14.year;
  YVar4.month = local_14.month;
  return YVar4;
}

Assistant:

QCalendar::YearMonthDay QJalaliCalendar::julianDayToDate(qint64 jd) const
{
    const int c = cycle(jd);
    int yearInCycle = qFloor((jd - cycleStart(c)) / yearLength);
    int year = yearInCycle + 475 + c * cycleYears;
    int day = jd - firstDayOfYear(yearInCycle, c) + 1;
    if (day > daysInYear(year <= 0 ? year - 1 : year)) {
        ++year;
        day = 1;
    }
    if (year <= 0)
        year--;
    int month;
    for (month = 1; month < 12; ++month) {
        const int last = daysInMonth(month, year);
        if (day <= last)
            break;
        day -= last;
    }
    return QCalendar::YearMonthDay(year, month, day);
}